

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_object.cpp
# Opt level: O2

void __thiscall Object_Nested_Test<char>::TestBody(Object_Nested_Test<char> *this)

{
  allocator_type *__a;
  void *__buf;
  long lVar1;
  char *message;
  initializer_list<pstore::dump::object::member> __l;
  initializer_list<pstore::dump::object::member> __l_00;
  char *in_stack_fffffffffffffdd0;
  AssertionResult gtest_ar;
  value_ptr local_208;
  value_ptr local_1f8;
  undefined1 local_1e8 [16];
  string local_1d8;
  __uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1b8 [4];
  undefined1 local_198 [16];
  object local_188;
  vector<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_> local_160;
  string local_148;
  string local_128;
  __string_type actual;
  member local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> expected;
  member local_78;
  vector<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_> local_48;
  
  std::__cxx11::string::string((string *)&gtest_ar,"k1",(allocator *)&stack0xfffffffffffffdd7);
  std::__cxx11::string::string((string *)local_1b8,"value1",(allocator *)&stack0xfffffffffffffdd6);
  pstore::dump::make_value((string *)local_198);
  pstore::dump::object::member::member((member *)&actual,(string *)&gtest_ar,(value_ptr *)local_198)
  ;
  std::__cxx11::string::string
            ((string *)(local_1e8 + 0x10),"k2",(allocator *)&stack0xfffffffffffffdd5);
  std::__cxx11::string::string((string *)&local_128,"ik1",(allocator *)&stack0xfffffffffffffdd4);
  pstore::dump::make_value(in_stack_fffffffffffffdd0);
  pstore::dump::object::member::member((member *)&expected,&local_128,&local_1f8);
  std::__cxx11::string::string((string *)&local_148,"ik2",(allocator *)&stack0xfffffffffffffdd3);
  pstore::dump::make_value(in_stack_fffffffffffffdd0);
  pstore::dump::object::member::member(&local_78,&local_148,&local_208);
  __l._M_len = 2;
  __l._M_array = (iterator)&expected;
  std::vector<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_>::vector
            (&local_160,__l,(allocator_type *)&stack0xfffffffffffffdd2);
  pstore::dump::make_value((container *)local_1e8);
  pstore::dump::object::member::member
            (&local_d8,(string *)(local_1e8 + 0x10),(value_ptr *)local_1e8);
  __a = (allocator_type *)&stack0xfffffffffffffdd1;
  __l_00._M_len = 2;
  __l_00._M_array = (iterator)&actual;
  std::vector<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_>::vector
            (&local_48,__l_00,__a);
  local_188.super_value._vptr_value = (_func_int **)&PTR__object_001dab90;
  local_188.members_.
  super__Vector_base<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_>.
  _M_impl.super__Vector_impl_data._M_start =
       local_48.
       super__Vector_base<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_188.members_.
  super__Vector_base<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       local_48.
       super__Vector_base<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_188.members_.
  super__Vector_base<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       local_48.
       super__Vector_base<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_48.
  super__Vector_base<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.
  super__Vector_base<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_188.compact_ = false;
  std::vector<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_>::~vector
            (&local_48);
  lVar1 = 0x30;
  do {
    pstore::dump::object::member::~member((member *)((long)&actual._M_dataplus._M_p + lVar1));
    lVar1 = lVar1 + -0x30;
  } while (lVar1 != -0x30);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1e8 + 8));
  std::vector<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_>::~vector
            (&local_160);
  lVar1 = 0x30;
  do {
    pstore::dump::object::member::~member((member *)((long)&expected._M_dataplus._M_p + lVar1));
    lVar1 = lVar1 + -0x30;
  } while (lVar1 != -0x30);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_208.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__cxx11::string::~string((string *)&local_148);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_1f8.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::~string((string *)(local_1e8 + 0x10));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_198 + 8));
  std::__cxx11::string::~string((string *)local_1b8);
  std::__cxx11::string::~string((string *)&gtest_ar);
  pstore::dump::value::write(&local_188.super_value,(int)this + 0x10,__buf,(size_t)__a);
  std::__cxx11::stringbuf::str();
  convert<char>(&expected,"k1 : value1\nk2 : \n    ik1 : iv1\n    ik2 : iv2");
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar,"expected","actual",&expected,&actual);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)local_1b8);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      message = "";
    }
    else {
      message = *(char **)gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)(local_1e8 + 0x10),kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/dump/test_object.cpp"
               ,0x95,message);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)(local_1e8 + 0x10),(Message *)local_1b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)(local_1e8 + 0x10));
    if (local_1b8[0]._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl !=
        (_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(long *)local_1b8[0]._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  std::__cxx11::string::~string((string *)&expected);
  std::__cxx11::string::~string((string *)&actual);
  pstore::dump::object::~object(&local_188);
  return;
}

Assistant:

TYPED_TEST (Object, Nested) {
    using namespace ::pstore::dump;
    object v{{
        {"k1", make_value (std::string ("value1"))},
        {"k2", make_value (object::container{
                   {"ik1", make_value ("iv1")},
                   {"ik2", make_value ("iv2")},
               })},
    }};
    v.write (this->out);
    auto const actual = this->out.str ();
    auto const expected = convert<TypeParam> ("k1 : value1\n"
                                              "k2 : \n"
                                              "    ik1 : iv1\n"
                                              "    ik2 : iv2");
    EXPECT_EQ (expected, actual);
}